

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  Descriptor *descriptor;
  long lVar2;
  FieldDescriptor *field;
  Descriptor *in_R8;
  long lVar3;
  string local_70;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print<char[6],std::__cxx11::string>
            (printer,
             "/**\n * Serializes the message to binary data (in protobuf wire format).\n * @return {!Uint8Array}\n */\n$class$.prototype.serializeBinary = function() {\n  var writer = new jspb.BinaryWriter();\n  $class$.serializeBinaryToWriter(this, writer);\n  return writer.getResultBuffer();\n};\n\n\n/**\n * Serializes the given message to binary data (in protobuf wire\n * format), writing to the given BinaryWriter.\n * @param {!$class$} message\n * @param {!jspb.BinaryWriter} writer\n * @suppress {unusedLocalVariables} f is only used for nested messages\n */\n$class$.serializeBinaryToWriter = function(message, writer) {\n  var f = undefined;\n"
             ,(char (*) [6])0x3a2f2d,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (0 < *(int *)(desc + 0x68)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      field = (FieldDescriptor *)(*(long *)(desc + 0x28) + lVar3);
      bVar1 = anon_unknown_0::IgnoreField(field);
      if (!bVar1) {
        GenerateClassSerializeBinaryField
                  ((Generator *)field,options,printer,
                   (FieldDescriptor *)(*(long *)(desc + 0x28) + lVar3));
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x98;
    } while (lVar2 < *(int *)(desc + 0x68));
  }
  if (0 < *(int *)(desc + 0x78)) {
    descriptor = desc;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10),
               (FileDescriptor *)desc,in_R8);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,descriptor);
    io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,
               "  jspb.Message.serializeBinaryExtensions(message, writer,\n    $extobj$Binary, $class$.prototype.getExtension);\n"
               ,(char (*) [7])"extobj",&local_70,(char (*) [6])0x3a2f2d,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  io::Printer::Print<>(printer,"};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinary(const GeneratorOptions& options,
                                             io::Printer* printer,
                                             const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Serializes the message to binary data (in protobuf wire format).\n"
      " * @return {!Uint8Array}\n"
      " */\n"
      "$class$.prototype.serializeBinary = function() {\n"
      "  var writer = new jspb.BinaryWriter();\n"
      "  $class$.serializeBinaryToWriter(this, writer);\n"
      "  return writer.getResultBuffer();\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Serializes the given message to binary data (in protobuf wire\n"
      " * format), writing to the given BinaryWriter.\n"
      " * @param {!$class$} message\n"
      " * @param {!jspb.BinaryWriter} writer\n"
      " * @suppress {unusedLocalVariables} f is only used for nested messages\n"
      " */\n"
      "$class$.serializeBinaryToWriter = function(message, "
      "writer) {\n"
      "  var f = undefined;\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassSerializeBinaryField(options, printer, desc->field(i));
    }
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.serializeBinaryExtensions(message, writer,\n"
        "    $extobj$Binary, $class$.prototype.getExtension);\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc), "class",
        GetMessagePath(options, desc));
  }

  printer->Print(
      "};\n"
      "\n"
      "\n");
}